

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::GTestFlagSaver::GTestFlagSaver(GTestFlagSaver *this)

{
  byte *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  std::__cxx11::string::string((string *)(in_RDI + 0x50));
  std::__cxx11::string::string((string *)(in_RDI + 0x70));
  std::__cxx11::string::string((string *)(in_RDI + 0x98));
  std::__cxx11::string::string((string *)(in_RDI + 0xd0));
  *in_RDI = FLAGS_gtest_also_run_disabled_tests & 1;
  in_RDI[1] = FLAGS_gtest_break_on_failure & 1;
  in_RDI[2] = FLAGS_gtest_catch_exceptions & 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)FLAGS_gtest_color_abi_cxx11_);
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x28),(string *)FLAGS_gtest_death_test_style_abi_cxx11_);
  in_RDI[0x48] = FLAGS_gtest_death_test_use_fork & 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x50),(string *)FLAGS_gtest_filter_abi_cxx11_)
  ;
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x70),(string *)FLAGS_gtest_internal_run_death_test_abi_cxx11_);
  in_RDI[0x90] = FLAGS_gtest_list_tests & 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x98),(string *)FLAGS_gtest_output_abi_cxx11_)
  ;
  in_RDI[0xb8] = FLAGS_gtest_print_time & 1;
  *(undefined4 *)(in_RDI + 0xbc) = FLAGS_gtest_random_seed;
  *(undefined4 *)(in_RDI + 0xc0) = FLAGS_gtest_repeat;
  in_RDI[0xc4] = FLAGS_gtest_shuffle & 1;
  *(undefined4 *)(in_RDI + 200) = FLAGS_gtest_stack_trace_depth;
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0xd0),(string *)FLAGS_gtest_stream_result_to_abi_cxx11_);
  in_RDI[0xf0] = FLAGS_gtest_throw_on_failure & 1;
  return;
}

Assistant:

GTestFlagSaver() {
    also_run_disabled_tests_ = GTEST_FLAG(also_run_disabled_tests);
    break_on_failure_ = GTEST_FLAG(break_on_failure);
    catch_exceptions_ = GTEST_FLAG(catch_exceptions);
    color_ = GTEST_FLAG(color);
    death_test_style_ = GTEST_FLAG(death_test_style);
    death_test_use_fork_ = GTEST_FLAG(death_test_use_fork);
    filter_ = GTEST_FLAG(filter);
    internal_run_death_test_ = GTEST_FLAG(internal_run_death_test);
    list_tests_ = GTEST_FLAG(list_tests);
    output_ = GTEST_FLAG(output);
    print_time_ = GTEST_FLAG(print_time);
    random_seed_ = GTEST_FLAG(random_seed);
    repeat_ = GTEST_FLAG(repeat);
    shuffle_ = GTEST_FLAG(shuffle);
    stack_trace_depth_ = GTEST_FLAG(stack_trace_depth);
    stream_result_to_ = GTEST_FLAG(stream_result_to);
    throw_on_failure_ = GTEST_FLAG(throw_on_failure);
  }